

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_func_call_arguments.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::FixFuncCallArgumentsPass::FixFuncCallArguments
          (FixFuncCallArgumentsPass *this,Instruction *func_call_inst)

{
  IRContext *pIVar1;
  DefUseManager *this_00;
  pointer pOVar2;
  uint32_t id;
  uint uVar3;
  Operand *this_01;
  Instruction *operand_inst;
  ulong uVar4;
  ulong uVar5;
  uint32_t index;
  uint32_t uVar6;
  undefined1 local_58 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  uVar3 = (func_call_inst->has_result_id_ & 1) + 1;
  if (func_call_inst->has_type_id_ == false) {
    uVar3 = (uint)func_call_inst->has_result_id_;
  }
  index = 0;
  uVar6 = index;
  if (uVar3 != (int)((ulong)((long)(func_call_inst->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(func_call_inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555) {
    uVar6 = 0;
    do {
      this_01 = Instruction::GetInOperand(func_call_inst,index);
      if (this_01->type == SPV_OPERAND_TYPE_ID) {
        pIVar1 = (this->super_Pass).context_;
        if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar1);
        }
        this_00 = (pIVar1->def_use_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                  _M_head_impl;
        id = Operand::AsId(this_01);
        operand_inst = analysis::DefUseManager::GetDef(this_00,id);
        if (operand_inst->opcode_ == OpAccessChain) {
          local_58._16_4_ = ReplaceAccessChainFuncCallArguments(this,func_call_inst,operand_inst);
          local_58._0_8_ = &PTR__SmallVector_009488e0;
          local_58._24_8_ = local_58 + 0x10;
          local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_58._8_8_ = 1;
          uVar3 = (func_call_inst->has_result_id_ & 1) + 1;
          if (func_call_inst->has_type_id_ == false) {
            uVar3 = (uint)func_call_inst->has_result_id_;
          }
          uVar4 = (ulong)(uVar3 + index);
          pOVar2 = (func_call_inst->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar5 = ((long)(func_call_inst->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
                  -0x5555555555555555;
          if (uVar5 < uVar4 || uVar5 - uVar4 == 0) {
            __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2b8,
                          "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                         );
          }
          if (uVar3 + index < uVar3) {
            __assert_fail("index >= TypeResultIdCount() && \"operand is not a in-operand\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2b9,
                          "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                         );
          }
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    (&pOVar2[uVar4].words,(SmallVector<unsigned_int,_2UL> *)local_58);
          local_58._0_8_ = &PTR__SmallVector_009488e0;
          if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_38,local_38._M_head_impl);
          }
          uVar6 = 1;
        }
      }
      index = index + 1;
      uVar3 = (func_call_inst->has_result_id_ & 1) + 1;
      if (func_call_inst->has_type_id_ == false) {
        uVar3 = (uint)func_call_inst->has_result_id_;
      }
    } while (index < (int)((ulong)((long)(func_call_inst->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(func_call_inst->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555 - uVar3);
  }
  if ((uVar6 != 0) &&
     (pIVar1 = (this->super_Pass).context_,
     (pIVar1->valid_analyses_ & kAnalysisBegin) != kAnalysisNone)) {
    analysis::DefUseManager::UpdateDefUse
              ((pIVar1->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               func_call_inst);
  }
  return SUB41(uVar6,0);
}

Assistant:

bool FixFuncCallArgumentsPass::FixFuncCallArguments(
    Instruction* func_call_inst) {
  bool modified = false;
  for (uint32_t i = 0; i < func_call_inst->NumInOperands(); ++i) {
    Operand& op = func_call_inst->GetInOperand(i);
    if (op.type != SPV_OPERAND_TYPE_ID) continue;
    Instruction* operand_inst = get_def_use_mgr()->GetDef(op.AsId());
    if (operand_inst->opcode() == spv::Op::OpAccessChain) {
      uint32_t var_id =
          ReplaceAccessChainFuncCallArguments(func_call_inst, operand_inst);
      func_call_inst->SetInOperand(i, {var_id});
      modified = true;
    }
  }
  if (modified) {
    context()->UpdateDefUse(func_call_inst);
  }
  return modified;
}